

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::AllocateOptionsImpl<google::protobuf::Descriptor>
          (DescriptorBuilder *this,string *name_scope,string *element_name,OptionsType *orig_options
          ,Descriptor *descriptor,vector<int,_std::allocator<int>_> *options_path,
          string *option_name)

{
  Tables *this_00;
  pointer pUVar1;
  bool bVar2;
  MessageOptions *this_01;
  UnknownFieldSet *pUVar3;
  Symbol SVar4;
  FieldDescriptor *pFVar5;
  long lVar6;
  Symbol extendee;
  int i;
  long lVar7;
  OptionsToInterpret local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  StringPiece local_40;
  
  this_01 = DescriptorPool::Tables::AllocateMessage<google::protobuf::MessageOptions>
                      (this->tables_,(MessageOptions *)0x0);
  bVar2 = MessageOptions::IsInitialized(orig_options);
  if (bVar2) {
    MessageLite::SerializeAsString_abi_cxx11_(&local_c8.name_scope,(MessageLite *)orig_options);
    MessageLite::ParseFromString((MessageLite *)this_01,&local_c8.name_scope);
    std::__cxx11::string::~string((string *)&local_c8);
    *(MessageOptions **)(descriptor + 0x20) = this_01;
    if (0 < (this_01->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_) {
      anon_unknown_1::OptionsToInterpret::OptionsToInterpret
                (&local_c8,name_scope,element_name,options_path,&orig_options->super_Message,
                 &this_01->super_Message);
      std::
      vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
      ::push_back(&this->options_to_interpret_,&local_c8);
      anon_unknown_1::OptionsToInterpret::~OptionsToInterpret(&local_c8);
    }
    pUVar3 = MessageOptions::unknown_fields(orig_options);
    if ((pUVar3->fields_).
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pUVar3->fields_).
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = this->tables_;
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_40,option_name);
      SVar4 = DescriptorPool::Tables::FindSymbol(this_00,local_40);
      if ((SVar4.ptr_ != (SymbolBase *)0x0) && ((SVar4.ptr_)->symbol_type_ == '\x01')) {
        lVar6 = 0;
        for (lVar7 = 0;
            pUVar1 = (pUVar3->fields_).
                     super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            lVar7 < (int)((ulong)((long)(pUVar3->fields_).
                                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1)
                         >> 4); lVar7 = lVar7 + 1) {
          extendee.ptr_ = (SymbolBase *)(Descriptor *)0x0;
          if ((SVar4.ptr_)->symbol_type_ == '\x01') {
            extendee = SVar4;
          }
          pFVar5 = DescriptorPool::InternalFindExtensionByNumberNoLock
                             (this->pool_,(Descriptor *)extendee.ptr_,
                              *(int *)((long)&pUVar1->number_ + lVar6));
          if (pFVar5 != (FieldDescriptor *)0x0) {
            local_c8.name_scope._M_dataplus._M_p = *(pointer *)(pFVar5 + 0x10);
            std::
            _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::erase(&(this->unused_dependency_)._M_t,(key_type *)&local_c8);
          }
          lVar6 = lVar6 + 0x10;
        }
      }
    }
  }
  else {
    std::operator+(&local_60,name_scope,".");
    std::operator+(&local_c8.name_scope,&local_60,element_name);
    AddError(this,&local_c8.name_scope,&orig_options->super_Message,OPTION_NAME,
             "Uninterpreted option is missing name or value.");
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void DescriptorBuilder::AllocateOptionsImpl(
    const std::string& name_scope, const std::string& element_name,
    const typename DescriptorT::OptionsType& orig_options,
    DescriptorT* descriptor, const std::vector<int>& options_path,
    const std::string& option_name) {
  // We need to use a dummy pointer to work around a bug in older versions of
  // GCC.  Otherwise, the following two lines could be replaced with:
  //   typename DescriptorT::OptionsType* options =
  //       tables_->AllocateMessage<typename DescriptorT::OptionsType>();
  typename DescriptorT::OptionsType* const dummy = nullptr;
  typename DescriptorT::OptionsType* options = tables_->AllocateMessage(dummy);

  if (!orig_options.IsInitialized()) {
    AddError(name_scope + "." + element_name, orig_options,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "Uninterpreted option is missing name or value.");
    return;
  }

  // Avoid using MergeFrom()/CopyFrom() in this class to make it -fno-rtti
  // friendly. Without RTTI, MergeFrom() and CopyFrom() will fallback to the
  // reflection based method, which requires the Descriptor. However, we are in
  // the middle of building the descriptors, thus the deadlock.
  options->ParseFromString(orig_options.SerializeAsString());
  descriptor->options_ = options;

  // Don't add to options_to_interpret_ unless there were uninterpreted
  // options.  This not only avoids unnecessary work, but prevents a
  // bootstrapping problem when building descriptors for descriptor.proto.
  // descriptor.proto does not contain any uninterpreted options, but
  // attempting to interpret options anyway will cause
  // OptionsType::GetDescriptor() to be called which may then deadlock since
  // we're still trying to build it.
  if (options->uninterpreted_option_size() > 0) {
    options_to_interpret_.push_back(OptionsToInterpret(
        name_scope, element_name, options_path, &orig_options, options));
  }

  // If the custom option is in unknown fields, no need to interpret it.
  // Remove the dependency file from unused_dependency.
  const UnknownFieldSet& unknown_fields = orig_options.unknown_fields();
  if (!unknown_fields.empty()) {
    // Can not use options->GetDescriptor() which may case deadlock.
    Symbol msg_symbol = tables_->FindSymbol(option_name);
    if (msg_symbol.type() == Symbol::MESSAGE) {
      for (int i = 0; i < unknown_fields.field_count(); ++i) {
        assert_mutex_held(pool_);
        const FieldDescriptor* field =
            pool_->InternalFindExtensionByNumberNoLock(
                msg_symbol.descriptor(), unknown_fields.field(i).number());
        if (field) {
          unused_dependency_.erase(field->file());
        }
      }
    }
  }
}